

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O3

int cache_put6(uint64_t a,uint64_t b,uint64_t c,uint64_t d,uint64_t e,uint64_t f,uint64_t res1,
              uint64_t res2)

{
  ulong uVar1;
  uint32_t *puVar2;
  ulong uVar3;
  int iVar4;
  cache_entry_t pcVar5;
  ulong uVar6;
  bool bVar7;
  
  puVar2 = cache_status;
  uVar3 = ((((((a >> 0x20 ^ a ^ 0xcbf29ce484222325) * 0x100000001b3 ^ b) * 0x100000001b3 ^ c) *
             0x100000001b3 ^ d) * 0x100000001b3 ^ e) * 0x100000001b3 ^ f) * 0x100000001b3;
  uVar6 = (cache_mask & uVar3) >> 1;
  pcVar5 = cache_table + uVar6 * 2;
  uVar1 = *(ulong *)(cache_status + uVar6 * 2);
  iVar4 = 0;
  if ((uVar1 & 0x8000000080000000) == 0) {
    uVar3 = (ulong)((uint)(uVar3 >> 0x20) & 0x7bff0000);
    uVar3 = uVar3 + 0x4000000 +
            ((ulong)((int)uVar1 + 1U & 0xffff) |
            uVar1 + 0x100000000 & 0xffff00000000 | uVar3 + 0x4000000 << 0x20);
    LOCK();
    bVar7 = uVar1 == *(ulong *)(cache_status + uVar6 * 2);
    if (bVar7) {
      *(ulong *)(cache_status + uVar6 * 2) = uVar3 | 0x8000000080000000;
    }
    UNLOCK();
    iVar4 = 0;
    if (bVar7) {
      pcVar5->a = a;
      pcVar5->b = b;
      pcVar5->c = c;
      pcVar5[1].a = d;
      pcVar5[1].b = e;
      pcVar5[1].c = f;
      pcVar5->res = res1;
      iVar4 = 1;
      pcVar5[1].res = res2;
      *(ulong *)(puVar2 + uVar6 * 2) = uVar3;
    }
  }
  return iVar4;
}

Assistant:

int
cache_put6(uint64_t a, uint64_t b, uint64_t c, uint64_t d, uint64_t e, uint64_t f, uint64_t res1, uint64_t res2)
{
    const uint64_t hash = cache_hash6(a, b, c, d, e, f);
#if CACHE_MASK
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash & cache_mask)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash & cache_mask)/2;
#else
    _Atomic(uint64_t) *s_bucket = (_Atomic(uint64_t)*)cache_status + (hash % cache_size)/2;
    cache6_entry_t bucket = (cache6_entry_t)cache_table + (hash % cache_size)/2;
#endif
    // can be relaxed, we use cas afterwards to claim it
    uint64_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked
    if (s & 0x8000000080000000LL) return 0;
    // create new
    uint64_t new_s = ((hash>>32) & 0x7fff0000) | 0x04000000;
    new_s |= (new_s<<32);
    new_s |= (((s>>32)+1)&0xffff)<<32;
    new_s |= (s+1)&0xffff;
    // use cas to claim bucket
    if (!atomic_compare_exchange_weak(s_bucket, &s, new_s | 0x8000000080000000LL)) return 0;
    // cas succesful: write data
    bucket->a = a;
    bucket->b = b;
    bucket->c = c;
    bucket->d = d;
    bucket->e = e;
    bucket->f = f;
    bucket->res = res1;
    bucket->res2 = res2;
    // unlock status field
    atomic_store_explicit(s_bucket, new_s, memory_order_release);
    return 1;
}